

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

_Bool sesschan_send_signal(Channel *chan,ptrlen signame)

{
  _Bool _Var1;
  SessionSpecialCode local_34;
  SessionSpecialCode code;
  sesschan *sess;
  Channel *chan_local;
  ptrlen signame_local;
  
  local_34 = SS_EXITMENU;
  _Var1 = ptrlen_eq_string(signame,"INT");
  if (_Var1) {
    local_34 = SS_SIGINT;
  }
  _Var1 = ptrlen_eq_string(signame,"TERM");
  if (_Var1) {
    local_34 = SS_SIGTERM;
  }
  _Var1 = ptrlen_eq_string(signame,"KILL");
  if (_Var1) {
    local_34 = SS_SIGKILL;
  }
  _Var1 = ptrlen_eq_string(signame,"QUIT");
  if (_Var1) {
    local_34 = SS_SIGQUIT;
  }
  _Var1 = ptrlen_eq_string(signame,"HUP");
  if (_Var1) {
    local_34 = SS_SIGHUP;
  }
  _Var1 = ptrlen_eq_string(signame,"ABRT");
  if (_Var1) {
    local_34 = SS_SIGABRT;
  }
  _Var1 = ptrlen_eq_string(signame,"ALRM");
  if (_Var1) {
    local_34 = SS_SIGALRM;
  }
  _Var1 = ptrlen_eq_string(signame,"FPE");
  if (_Var1) {
    local_34 = SS_SIGFPE;
  }
  _Var1 = ptrlen_eq_string(signame,"ILL");
  if (_Var1) {
    local_34 = SS_SIGILL;
  }
  _Var1 = ptrlen_eq_string(signame,"PIPE");
  if (_Var1) {
    local_34 = SS_SIGPIPE;
  }
  _Var1 = ptrlen_eq_string(signame,"SEGV");
  if (_Var1) {
    local_34 = SS_SIGSEGV;
  }
  _Var1 = ptrlen_eq_string(signame,"USR1");
  if (_Var1) {
    local_34 = SS_SIGUSR1;
  }
  _Var1 = ptrlen_eq_string(signame,"USR2");
  if (_Var1) {
    local_34 = SS_SIGUSR2;
  }
  if (local_34 != SS_EXITMENU) {
    backend_special(*(Backend **)&chan[-5].initial_fixed_window_size,local_34,0);
  }
  return local_34 != SS_EXITMENU;
}

Assistant:

bool sesschan_send_signal(Channel *chan, ptrlen signame)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    /* Start with a code that definitely isn't a signal (or indeed a
     * special command at all), to indicate 'nothing matched'. */
    SessionSpecialCode code = SS_EXITMENU;

    #define SIGNAL_SUB(name) \
        if (ptrlen_eq_string(signame, #name)) code = SS_SIG ## name;
    #define SIGNAL_MAIN(name, text) SIGNAL_SUB(name)
    #include "signal-list.h"
    #undef SIGNAL_MAIN
    #undef SIGNAL_SUB

    if (code == SS_EXITMENU)
        return false;

    backend_special(sess->backend, code, 0);
    return true;
}